

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::checkTransformFeedbackBuffer
          (CaptureVertexSeparate *this,BindBufferCase bind_case,GLenum primitive_type)

{
  long *plVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  undefined4 in_register_00000034;
  int iVar13;
  float *pfVar14;
  bool bVar15;
  
  plVar1 = *(long **)(*(long *)(&this->field_0x78 + (long)this->_vptr_CaptureVertexSeparate[-3]) + 8
                     );
  lVar6 = (**(code **)(*plVar1 + 0x18))(plVar1,CONCAT44(in_register_00000034,bind_case));
  if (6 < primitive_type) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&int::typeinfo,0);
  }
  uVar2 = *(ulong *)(&DAT_01a45f68 + (ulong)primitive_type * 8);
  iVar4 = this->m_max_transform_feedback_separate_attribs + -1;
  bVar12 = true;
  if (0 < iVar4) {
    iVar13 = 0;
    lVar11 = 0;
    do {
      (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_buffers[lVar11]);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBindBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xd0d);
      lVar7 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glMapBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xd10);
      if (bVar12) {
        uVar8 = 0;
        do {
          uVar10 = 0;
          do {
            bVar3 = false;
            if (0.125 < ABS(*(float *)(lVar7 + uVar10 * 4) - (float)(uint)(iVar13 + (int)uVar10)))
            break;
            bVar15 = uVar10 < 3;
            uVar10 = uVar10 + 1;
            bVar3 = bVar12;
          } while (bVar15);
          bVar12 = bVar3;
          uVar8 = uVar8 + 1;
        } while ((uVar8 < uVar2) && (lVar7 = lVar7 + 0x10, bVar12 != false));
      }
      (**(code **)(lVar6 + 0x1670))(0x8c8e);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glUnmapBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xd23);
      lVar11 = lVar11 + 1;
      iVar4 = this->m_max_transform_feedback_separate_attribs + -1;
      iVar13 = iVar13 + 4;
    } while (lVar11 < iVar4);
  }
  if (bVar12 != false) {
    (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_buffers[iVar4]);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd2a);
    lVar11 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glMapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd2d);
    if (bVar12 != false) {
      pfVar14 = (float *)(lVar11 + 0xc);
      uVar8 = 1;
      do {
        bVar3 = false;
        bVar15 = false;
        if (ABS(ABS(pfVar14[-3]) + -1.0 + 0.0625) <= 0.125) {
          bVar3 = false;
          if (0.125 < ABS(ABS(pfVar14[-2]) + -1.0 + 0.0625)) {
            bVar15 = false;
          }
          else if ((ABS(pfVar14[-1]) <= 0.125) && (bVar3 = false, ABS(*pfVar14 + -1.0) <= 0.125)) {
            bVar3 = true;
            bVar15 = bVar12;
          }
        }
        bVar12 = bVar15;
        if ((!bVar3) || (uVar2 <= uVar8)) break;
        pfVar14 = pfVar14 + 4;
        uVar8 = uVar8 + 1;
      } while (bVar12 != false);
    }
    (**(code **)(lVar6 + 0x1670))(0x8c8e);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUnmapBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xd3e);
  }
  return bVar12;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexSeparate::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint number_of_vertices = 0;

	switch (primitive_type)
	{
	case GL_POINTS:
		number_of_vertices = 4;
		break;
	case GL_LINES:
		number_of_vertices = 4;
		break;
	case GL_LINE_LOOP:
		number_of_vertices = 8;
		break;
	case GL_LINE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLES:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_FAN:
		number_of_vertices = 6;
		break;
	default:
		throw 0;
	}

	bool is_ok = true;

	for (glw::GLint i = 0; i < m_max_transform_feedback_separate_attribs - 1; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffers[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

		for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
		{
			for (glw::GLuint k = 0; k < 4 /* vec4 */; ++k)
			{
				glw::GLfloat result	= results[j * 4 + k];
				glw::GLfloat reference = (glw::GLfloat)(i * 4 + k);

				if (fabs(result - reference) > 0.125 /* precision */)
				{
					is_ok = false;

					break;
				}
			}
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");
	}

	/* gl_Position */
	if (is_ok)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffers[m_max_transform_feedback_separate_attribs - 1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

		for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
		{
			glw::GLfloat result[4] = { results[j * 4], results[j * 4 + 1], results[j * 4 + 2], results[j * 4 + 3] };

			if ((fabs(fabs(result[0]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
				(fabs(fabs(result[1]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
				(fabs(result[2]) > 0.125 /* precision */) || (fabs(result[3] - 1.0) > 0.125 /* precision */))
			{
				is_ok = false;

				break;
			}
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");
	}

	return is_ok;
}